

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void al_replace_path_component(ALLEGRO_PATH *path,int i,char *s)

{
  size_t sVar1;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 0) {
    sVar1 = _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
    in_ESI = (int)sVar1 + in_ESI;
  }
  get_segment((ALLEGRO_PATH *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (uint)((ulong)in_RDX >> 0x20));
  al_ustr_assign_cstr((ALLEGRO_USTR *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return;
}

Assistant:

void al_replace_path_component(ALLEGRO_PATH *path, int i, const char *s)
{
   ASSERT(path);
   ASSERT(s);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_assign_cstr(get_segment(path, i), s);
}